

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall slang::ast::DefParamVisitor::~DefParamVisitor(DefParamVisitor *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 *)&this->activeInstances);
  SmallVectorBase<const_slang::ast::DefParamSymbol_*>::cleanup
            ((SmallVectorBase<const_slang::ast::DefParamSymbol_*> *)this,in_RSI);
  return;
}

Assistant:

DefParamVisitor(size_t maxInstanceDepth, size_t generateLevel) :
        maxInstanceDepth(maxInstanceDepth), generateLevel(generateLevel) {}